

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

_ElementType * __thiscall
Lib::
CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
::next(_ElementType *__return_storage_ptr__,
      CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
      *this)

{
  int iVar1;
  IteratorCore<Indexing::TermLiteralClause> *pIVar2;
  
  if (this->_first == true) {
    iVar1 = (*((this->_it1)._core)->_vptr_IteratorCore[2])();
    if ((char)iVar1 != '\0') goto LAB_004ea47f;
    this->_first = false;
  }
  (*((this->_it2)._iter._core)->_vptr_IteratorCore[2])();
LAB_004ea47f:
  if (this->_first == true) {
    pIVar2 = (this->_it1)._core;
  }
  else {
    pIVar2 = (this->_it2)._iter._core;
  }
  (*pIVar2->_vptr_IteratorCore[3])(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }